

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSpecsOf.hpp
# Opt level: O2

void __thiscall
sciplot::LineSpecsOf<sciplot::DrawSpecs>::LineSpecsOf
          (LineSpecsOf<sciplot::DrawSpecs> *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x28)) = vtt[1];
  (this->m_linestyle)._M_dataplus._M_p = (pointer)&(this->m_linestyle).field_2;
  (this->m_linestyle)._M_string_length = 0;
  (this->m_linestyle).field_2._M_local_buf[0] = '\0';
  (this->m_linetype)._M_dataplus._M_p = (pointer)&(this->m_linetype).field_2;
  (this->m_linetype)._M_string_length = 0;
  (this->m_linetype).field_2._M_local_buf[0] = '\0';
  (this->m_linewidth)._M_dataplus._M_p = (pointer)&(this->m_linewidth).field_2;
  (this->m_linewidth)._M_string_length = 0;
  (this->m_linewidth).field_2._M_local_buf[0] = '\0';
  (this->m_linecolor)._M_dataplus._M_p = (pointer)&(this->m_linecolor).field_2;
  (this->m_linecolor)._M_string_length = 0;
  (this->m_linecolor).field_2._M_local_buf[0] = '\0';
  (this->m_dashtype)._M_dataplus._M_p = (pointer)&(this->m_dashtype).field_2;
  (this->m_dashtype)._M_string_length = 0;
  (this->m_dashtype).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

LineSpecsOf<DerivedSpecs>::LineSpecsOf()
{
}